

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

string * __thiscall CentralBroker::getAddress_abi_cxx11_(CentralBroker *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x38));
  return in_RDI;
}

Assistant:

std::string CentralBroker::getAddress() const
{
    return address;
}